

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMap<QString,_QDBusIntrospection::Annotation>::insert
          (QMap<QString,_QDBusIntrospection::Annotation> *this,QString *key,Annotation *value)

{
  long lVar1;
  bool bVar2;
  QMap<QString,_QDBusIntrospection::Annotation> *in_RDI;
  long in_FS_OFFSET;
  QMap<QString,_QDBusIntrospection::Annotation> copy;
  iterator in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  key_type *in_stack_ffffffffffffffd0;
  map<QString,_QDBusIntrospection::Annotation,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Annotation>_>_>
  *this_00;
  iterator local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (map<QString,_QDBusIntrospection::Annotation,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Annotation>_>_>
             *)&DAT_aaaaaaaaaaaaaaaa;
  bVar2 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QDBusIntrospection::Annotation,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Annotation>_>_>_>_>
          ::isShared(&in_RDI->d);
  if (bVar2) {
    QMap(in_RDI,(QMap<QString,_QDBusIntrospection::Annotation> *)in_stack_ffffffffffffff98._M_node);
  }
  else {
    memset(&stack0xffffffffffffffd8,0,8);
    QMap((QMap<QString,_QDBusIntrospection::Annotation> *)0x2449d2);
  }
  detach(in_RDI);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QDBusIntrospection::Annotation,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Annotation>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QDBusIntrospection::Annotation,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Annotation>_>_>_>_>
                *)0x2449e6);
  std::
  map<QString,QDBusIntrospection::Annotation,std::less<QString>,std::allocator<std::pair<QString_const,QDBusIntrospection::Annotation>>>
  ::insert_or_assign<QDBusIntrospection::Annotation_const&>
            (this_00,in_stack_ffffffffffffffd0,
             (Annotation *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
  iterator::iterator((iterator *)0x244a30,in_stack_ffffffffffffff98);
  ~QMap((QMap<QString,_QDBusIntrospection::Annotation> *)0x244a3a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)(iterator)local_20._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        // TODO: improve. In case of assignment, why copying first?
        detach();
        return iterator(d->m.insert_or_assign(key, value).first);
    }